

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int ptrmapGet(BtShared *pBt,Pgno key,u8 *pEType,Pgno *pPgno)

{
  void *pvVar1;
  uint uVar2;
  Pgno pgno;
  int iVar3;
  u32 uVar4;
  DbPage *pDbPage;
  
  pgno = ptrmapPageno(pBt,key);
  iVar3 = sqlite3PagerAcquire(pBt->pPager,pgno,&pDbPage,0);
  if (iVar3 == 0) {
    uVar2 = (~pgno + key) * 5;
    if ((int)uVar2 < 0) {
      sqlite3PagerUnref(pDbPage);
      iVar3 = 0xc4eb;
    }
    else {
      pvVar1 = pDbPage->pData;
      *pEType = *(u8 *)((long)pvVar1 + (ulong)uVar2);
      if (pPgno != (Pgno *)0x0) {
        uVar4 = sqlite3Get4byte((u8 *)((long)pvVar1 + (ulong)uVar2 + 1));
        *pPgno = uVar4;
      }
      sqlite3PagerUnref(pDbPage);
      iVar3 = 0xc4f3;
      if (0xfa < (byte)(*pEType - 6)) {
        return 0;
      }
    }
    sqlite3CorruptError(iVar3);
    iVar3 = 0xb;
  }
  return iVar3;
}

Assistant:

static int ptrmapGet(BtShared *pBt, Pgno key, u8 *pEType, Pgno *pPgno){
  DbPage *pDbPage;   /* The pointer map page */
  int iPtrmap;       /* Pointer map page index */
  u8 *pPtrmap;       /* Pointer map page data */
  int offset;        /* Offset of entry in pointer map */
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );

  iPtrmap = PTRMAP_PAGENO(pBt, key);
  rc = sqlite3PagerGet(pBt->pPager, iPtrmap, &pDbPage);
  if( rc!=0 ){
    return rc;
  }
  pPtrmap = (u8 *)sqlite3PagerGetData(pDbPage);

  offset = PTRMAP_PTROFFSET(iPtrmap, key);
  if( offset<0 ){
    sqlite3PagerUnref(pDbPage);
    return SQLITE_CORRUPT_BKPT;
  }
  assert( offset <= (int)pBt->usableSize-5 );
  assert( pEType!=0 );
  *pEType = pPtrmap[offset];
  if( pPgno ) *pPgno = get4byte(&pPtrmap[offset+1]);

  sqlite3PagerUnref(pDbPage);
  if( *pEType<1 || *pEType>5 ) return SQLITE_CORRUPT_BKPT;
  return SQLITE_OK;
}